

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::cmMakefileTargetGenerator
          (cmMakefileTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  cmGlobalUnixMakefileGenerator3 *pcVar4;
  cmState *this_00;
  string *this_01;
  unique_ptr<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  local_78;
  string_view local_70;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue ruleStatus;
  cmake *cm;
  cmGeneratorTarget *target_local;
  cmMakefileTargetGenerator *this_local;
  
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmMakefileTargetGenerator_01108790;
  std::__cxx11::string::string((string *)&this->BuildFileName);
  std::__cxx11::string::string((string *)&this->BuildFileNameFull);
  std::__cxx11::string::string((string *)&this->ProgressFileNameFull);
  this->CMP0113New = false;
  std::__cxx11::string::string((string *)&this->TargetBuildDirectory);
  std::__cxx11::string::string((string *)&this->TargetBuildDirectoryFull);
  std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
  unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
            ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
             &this->BuildFileStream);
  std::__cxx11::string::string((string *)&this->FlagFileNameFull);
  std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
  unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
            ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
             &this->FlagFileStream);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
  ::map(&this->FlagFileDepends);
  std::__cxx11::string::string((string *)&this->InfoFileNameFull);
  std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
  unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
            ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
             &this->InfoFileStream);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->CleanFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Objects);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ExternalObjects);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ObjectFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ExtraFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->CustomCommandOutputs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->MultipleOutputPairs);
  cmGeneratorTarget::Names::Names(&this->TargetNames);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->MacContentFolders);
  std::unique_ptr<cmOSXBundleGenerator,std::default_delete<cmOSXBundleGenerator>>::
  unique_ptr<std::default_delete<cmOSXBundleGenerator>,void>
            ((unique_ptr<cmOSXBundleGenerator,std::default_delete<cmOSXBundleGenerator>> *)
             &this->OSXBundleGenerator);
  std::
  unique_ptr<cmMakefileTargetGenerator::MacOSXContentGeneratorType,std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>>
  ::unique_ptr<std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>,void>
            ((unique_ptr<cmMakefileTargetGenerator::MacOSXContentGeneratorType,std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>>
              *)&this->MacOSXContentGenerator);
  this->CustomCommandDriver = OnBuild;
  pcVar3 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar3;
  pcVar4 = (cmGlobalUnixMakefileGenerator3 *)
           cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this->LocalGenerator);
  this->GlobalGenerator = pcVar4;
  ruleStatus.Value =
       (string *)cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this->GlobalGenerator);
  this->NoRuleMessages = false;
  this_00 = cmake::GetState((cmake *)ruleStatus.Value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"RULE_MESSAGES",&local_59);
  local_38 = cmState::GetGlobalProperty(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = cmValue::operator_cast_to_bool(&local_38);
  if (bVar1) {
    this_01 = cmValue::operator*[abi_cxx11_(&local_38);
    local_70 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    bVar1 = cmIsOff(local_70);
    this->NoRuleMessages = bVar1;
  }
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0113
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  if ((PVar2 == OLD) || (PVar2 == WARN)) {
    this->CMP0113New = false;
  }
  else if (PVar2 - NEW < 3) {
    this->CMP0113New = true;
  }
  std::make_unique<cmMakefileTargetGenerator::MacOSXContentGeneratorType,cmMakefileTargetGenerator*>
            ((cmMakefileTargetGenerator **)&local_78);
  std::
  unique_ptr<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  ::operator=(&this->MacOSXContentGenerator,&local_78);
  std::
  unique_ptr<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  ::~unique_ptr(&local_78);
  return;
}

Assistant:

cmMakefileTargetGenerator::cmMakefileTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
{
  this->CustomCommandDriver = OnBuild;
  this->LocalGenerator =
    static_cast<cmLocalUnixMakefileGenerator3*>(target->GetLocalGenerator());
  this->GlobalGenerator = static_cast<cmGlobalUnixMakefileGenerator3*>(
    this->LocalGenerator->GetGlobalGenerator());
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->NoRuleMessages = false;
  if (cmValue ruleStatus =
        cm->GetState()->GetGlobalProperty("RULE_MESSAGES")) {
    this->NoRuleMessages = cmIsOff(*ruleStatus);
  }
  switch (this->GeneratorTarget->GetPolicyStatusCMP0113()) {
    case cmPolicies::WARN:
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      this->CMP0113New = false;
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      this->CMP0113New = true;
      break;
  }
  this->MacOSXContentGenerator =
    cm::make_unique<MacOSXContentGeneratorType>(this);
}